

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O1

void pzshape::TPZShapeTetra::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  double *pdVar9;
  long *plVar10;
  uint uVar11;
  bool bVar12;
  int transformation_index;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int xj;
  long lVar17;
  long lVar18;
  long lVar19;
  TPZVec<double> *pt_00;
  int (*paiVar20) [3];
  ulong uVar21;
  uint uVar22;
  long lVar23;
  int xj_2;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined1 auVar29 [16];
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar40 [16];
  TPZVec<long> ids;
  TPZFMatrix<double> dphin_1;
  TPZFMatrix<double> phin_1;
  TPZManVector<double,_1> outvalvec;
  TPZFNMatrix<80,_double> phin;
  TPZFNMatrix<100,_double> phiblend;
  TPZFNMatrix<80,_double> dphin;
  TPZFNMatrix<100,_double> dphiblend;
  long local_1020;
  long local_1018;
  long local_fd8;
  TPZVec<double> local_fa8;
  double local_f88 [2];
  _func_int **local_f78;
  TPZFMatrix<double> local_f70;
  TPZFMatrix<double> local_ee0;
  TPZVec<long> *local_e50;
  TPZManVector<long,_10> local_e48;
  undefined1 local_dd8 [88];
  int local_d80 [6];
  undefined **local_d68;
  undefined1 local_d60 [16];
  int64_t local_d50;
  double local_d48 [81];
  TPZFMatrix<double> local_ac0;
  double local_a30 [101];
  undefined1 local_708 [16];
  long lStack_6f8;
  ushort local_6f0;
  double *local_6e8;
  double *local_6e0;
  int64_t local_6d8;
  undefined1 local_6d0 [32];
  int local_6b0 [6];
  undefined **local_698;
  undefined1 local_690 [16];
  int64_t local_680;
  double local_678 [82];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  
  local_e50 = id;
  CornerShape(pt,phi,dphi);
  bVar12 = true;
  lVar19 = 0;
  do {
    if (1 < order->fStore[lVar19]) {
      bVar12 = false;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0xb);
  if (!bVar12) {
    local_ac0.fElem = local_a30;
    local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0xf;
    local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0185f360;
    local_ac0.fSize = 100;
    local_ac0.fGiven = local_ac0.fElem;
    TPZVec<int>::TPZVec(&local_ac0.fPivot.super_TPZVec<int>,0);
    local_ac0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_ac0.fPivot.super_TPZVec<int>.fStore = local_ac0.fPivot.fExtAlloc;
    local_ac0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_ac0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_ac0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_ac0.fWork.fStore = (double *)0x0;
    local_ac0.fWork.fNElements = 0;
    local_ac0.fWork.fNAlloc = 0;
    local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0185f070;
    local_3e8.fElem = local_358;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0xf;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0185f360;
    local_3e8.fSize = 100;
    pt_00 = (TPZVec<double> *)&local_3e8.fPivot;
    local_3e8.fGiven = local_3e8.fElem;
    TPZVec<int>::TPZVec((TPZVec<int> *)pt_00,0);
    local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
    local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_3e8.fWork.fStore = (double *)0x0;
    local_3e8.fWork.fNElements = 0;
    local_3e8.fWork.fNAlloc = 0;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0185f070;
    lVar19 = 0;
    lVar23 = 0;
    do {
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar23) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
         (local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_ac0.fElem[lVar23] = phi->fElem[lVar23];
      lVar17 = 0;
      do {
        if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar17) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar23)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar17) ||
           (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar23)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_3e8.fElem +
         lVar17 * 8 + local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar19) =
             *(undefined8 *)
              ((long)dphi->fElem +
              lVar17 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar19);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar23 = lVar23 + 1;
      lVar19 = lVar19 + 8;
    } while (lVar23 != 4);
    ShapeGenerating(pt_00,&local_ac0,&local_3e8);
    local_1020 = 4;
    local_fd8 = 0x20;
    local_f78 = (_func_int **)&PTR__TPZFMatrix_0183c898;
    lVar19 = 0;
    do {
      pdVar9 = pt->fStore;
      dVar1 = (double)(&gRibTrans3dTetra1d)[lVar19 * 3];
      dVar2 = (double)(&DAT_01a58ea8)[lVar19 * 3];
      dVar3 = pdVar9[1];
      dVar4 = *pdVar9;
      dVar5 = (double)(&DAT_01a58eb0)[lVar19 * 3];
      dVar6 = pdVar9[2];
      dVar7 = (double)(&gRibSum3dTetra1d)[lVar19];
      TPZVec<long>::TPZVec((TPZVec<long> *)&local_fa8,2);
      TPZVec<double>::TPZVec((TPZVec<double> *)&local_e48,0);
      local_e48.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018df490;
      local_e48.super_TPZVec<long>.fStore = local_e48.fExtAlloc;
      local_e48.super_TPZVec<long>.fNElements = 1;
      local_e48.super_TPZVec<long>.fNAlloc = 0;
      iVar8 = pztopology::TPZTetrahedron::SideNodes[lVar19][1];
      plVar10 = local_e50->fStore;
      *local_fa8.fStore = (double)plVar10[pztopology::TPZTetrahedron::SideNodes[lVar19][0]];
      local_fa8.fStore[1] = (double)plVar10[iVar8];
      iVar8 = order->fStore[lVar19];
      uVar15 = iVar8 - 1;
      uVar24 = (ulong)(int)uVar15;
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_f78;
      local_ee0.fElem = (double *)local_708;
      local_ee0.fSize = 0x14;
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar24;
      local_ee0.fGiven = local_ee0.fElem;
      local_e48.fExtAlloc[0] = (long)(dVar5 * dVar6 + dVar1 * dVar4 + dVar2 * dVar3 + dVar7);
      TPZVec<int>::TPZVec(&local_ee0.fPivot.super_TPZVec<int>,0);
      local_ee0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_ee0.fPivot.super_TPZVec<int>.fStore = local_ee0.fPivot.fExtAlloc;
      local_ee0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_ee0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_ee0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_ee0.fWork.fStore = (double *)0x0;
      local_ee0.fWork.fNElements = 0;
      local_ee0.fWork.fNAlloc = 0;
      if (uVar15 == 0) {
        local_ee0.fElem = (double *)0x0;
      }
      else if (0x15 < iVar8) {
        local_ee0.fElem = (double *)operator_new__(uVar24 * 8);
      }
      local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
      local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_f78;
      local_f70.fElem = (double *)local_dd8;
      local_f70.fSize = 0x3c;
      local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar24;
      local_f70.fGiven = local_f70.fElem;
      TPZVec<int>::TPZVec(&local_f70.fPivot.super_TPZVec<int>,0);
      local_f70.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_f70.fPivot.super_TPZVec<int>.fStore = local_f70.fPivot.fExtAlloc;
      local_f70.fPivot.super_TPZVec<int>.fNElements = 0;
      local_f70.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_f70.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_f70.fWork.fStore = (double *)0x0;
      local_f70.fWork.fNElements = 0;
      local_f70.fWork.fNAlloc = 0;
      if (uVar15 == 0) {
        local_f70.fElem = (double *)0x0;
      }
      else if (0x15 < iVar8) {
        local_f70.fElem =
             (double *)operator_new__(-(ulong)(uVar24 * 3 >> 0x3d != 0) | uVar24 * 0x18);
      }
      memset(local_ee0.fElem,0,
             local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      memset(local_f70.fElem,0,
             local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      iVar13 = order->fStore[lVar19];
      transformation_index = TPZShapeLinear::GetTransformId1d((TPZVec<long> *)&local_fa8);
      TPZShapeLinear::ShapeInternal
                ((TPZVec<double> *)&local_e48,iVar13,&local_ee0,&local_f70,transformation_index);
      TransformDerivativeFromRibToTetra((int)lVar19,uVar15,&local_f70);
      if (1 < iVar8) {
        lVar23 = lVar19 + 4;
        local_1020 = (long)(int)local_1020;
        lVar17 = local_1020 * 8;
        lVar16 = 0;
        uVar24 = 0;
        do {
          if ((local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
             (local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar24) ||
             (local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_1020 < 0) ||
              ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_1020)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[local_1020] = local_ac0.fElem[lVar19 + 4] * local_ee0.fElem[uVar24];
          lVar18 = 0;
          do {
            if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar18) ||
               (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar23)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar24) ||
               (local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
               (local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar18) ||
               (local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar24)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar18) ||
                (local_1020 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_1020)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)
             ((long)dphi->fElem +
             lVar18 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar17) =
                 *(double *)
                  ((long)local_3e8.fElem +
                  lVar18 * 8 +
                  local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_fd8) *
                 local_ee0.fElem[uVar24] +
                 local_ac0.fElem[lVar19 + 4] *
                 *(double *)
                  ((long)local_f70.fElem +
                  lVar18 * 8 + local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar16);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_1020 = local_1020 + 1;
          uVar24 = uVar24 + 1;
          lVar16 = lVar16 + 8;
          lVar17 = lVar17 + 8;
        } while (uVar24 != uVar15);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_f70);
      TPZFMatrix<double>::~TPZFMatrix(&local_ee0);
      if (local_e48.super_TPZVec<long>.fStore == local_e48.fExtAlloc) {
        local_e48.super_TPZVec<long>.fStore = (long *)0x0;
      }
      local_e48.super_TPZVec<long>.fNAlloc = 0;
      local_e48.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      if (local_e48.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_e48.super_TPZVec<long>.fStore);
      }
      local_fa8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
      if (local_fa8.fStore != (double *)0x0) {
        operator_delete__(local_fa8.fStore);
      }
      lVar19 = lVar19 + 1;
      local_fd8 = local_fd8 + 8;
    } while (lVar19 != 6);
    paiVar20 = pztopology::TPZTetrahedron::FaceNodes;
    local_fd8 = 0x50;
    lVar19 = 0;
    do {
      if (2 < order->fStore[lVar19 + 6]) {
        TPZVec<double>::TPZVec(&local_fa8,0);
        local_fa8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01843b78;
        local_fa8.fStore = local_f88;
        local_fa8.fNElements = 2;
        local_fa8.fNAlloc = 0;
        ProjectPoint3dTetraToFace((int)lVar19,pt,&local_fa8);
        iVar8 = order->fStore[lVar19 + 6];
        if (2 < iVar8) {
          uVar22 = (iVar8 + -1) * (iVar8 + -2);
          uVar15 = uVar22 >> 1;
          uVar24 = (ulong)uVar15;
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               local_f78;
          local_ee0.fElem = (double *)local_708;
          local_ee0.fSize = 0x14;
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar24;
          local_ee0.fGiven = local_ee0.fElem;
          TPZVec<int>::TPZVec(&local_ee0.fPivot.super_TPZVec<int>,0);
          local_ee0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_ee0.fPivot.super_TPZVec<int>.fStore = local_ee0.fPivot.fExtAlloc;
          local_ee0.fPivot.super_TPZVec<int>.fNElements = 0;
          local_ee0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_ee0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_ee0.fWork.fStore = (double *)0x0;
          local_ee0.fWork.fNElements = 0;
          local_ee0.fWork.fNAlloc = 0;
          if (uVar22 < 2) {
            local_ee0.fElem = (double *)0x0;
          }
          else if (0x29 < uVar22) {
            local_ee0.fElem = (double *)operator_new__(uVar24 * 8);
          }
          local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               local_f78;
          local_f70.fElem = (double *)local_dd8;
          local_f70.fSize = 0x3c;
          local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar24;
          local_f70.fGiven = local_f70.fElem;
          TPZVec<int>::TPZVec(&local_f70.fPivot.super_TPZVec<int>,0);
          local_f70.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_f70.fPivot.super_TPZVec<int>.fStore = local_f70.fPivot.fExtAlloc;
          local_f70.fPivot.super_TPZVec<int>.fNElements = 0;
          local_f70.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_f70.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_f70.fWork.fStore = (double *)0x0;
          local_f70.fWork.fNElements = 0;
          local_f70.fWork.fNAlloc = 0;
          if (uVar22 < 2) {
            local_f70.fElem = (double *)0x0;
          }
          else if (0x29 < uVar22) {
            local_f70.fElem = (double *)operator_new__(uVar24 * 0x18);
          }
          memset(local_ee0.fElem,0,
                 local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
          local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
               local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
          memset(local_f70.fElem,0,
                 local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
          local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
               local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
          TPZManVector<long,_10>::TPZManVector(&local_e48,3);
          plVar10 = local_e50->fStore;
          lVar23 = 0;
          do {
            local_e48.super_TPZVec<long>.fStore[lVar23] = plVar10[(*paiVar20)[lVar23]];
            lVar23 = lVar23 + 1;
          } while (lVar23 != 3);
          iVar13 = TPZShapeTriang::GetTransformId2dT(&local_e48.super_TPZVec<long>);
          *local_fa8.fStore = (*local_fa8.fStore + 1.0) * 0.5;
          local_fa8.fStore[1] = (local_fa8.fStore[1] + 1.0) * 0.5;
          TPZShapeTriang::ShapeInternal(&local_fa8,iVar8 + -2,&local_ee0,&local_f70,iVar13);
          if (0 < (int)(uint)local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol) {
            uVar21 = 0;
            do {
              if ((local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
                 (local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar21)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_f70.fElem[local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar21] =
                   local_f70.fElem
                   [local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar21] * 0.5;
              if ((local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                 (local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar21)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_f70.fElem
              [local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar21 + 1] =
                   local_f70.fElem
                   [local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar21 + 1] * 0.5;
              if ((local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
                 (local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar21)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_f70.fElem
              [local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar21 + 2] =
                   local_f70.fElem
                   [local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar21 + 2] * 0.5;
              uVar21 = uVar21 + 1;
            } while (((uint)local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol & 0x7fffffff)
                     != uVar21);
          }
          TransformDerivativeFromFaceToTetra((int)lVar19,uVar15,&local_f70);
          if (1 < uVar22) {
            lVar23 = lVar19 + 10;
            if (uVar15 < 2) {
              uVar24 = 1;
            }
            local_1020 = (long)(int)local_1020;
            lVar17 = local_1020 * 8;
            lVar16 = 0;
            uVar21 = 0;
            do {
              if ((local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
                 (local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar21) ||
                 (local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((local_1020 < 0) ||
                  ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_1020)) ||
                 ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              phi->fElem[local_1020] = local_ac0.fElem[lVar19 + 10] * local_ee0.fElem[uVar21];
              lVar18 = 0;
              do {
                if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar18) ||
                   (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar23)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar21) ||
                   (local_ee0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
                   (local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar18) ||
                   (local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar21)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar18) ||
                    (local_1020 < 0)) ||
                   ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_1020)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)dphi->fElem +
                 lVar18 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar17) =
                     *(double *)
                      ((long)local_3e8.fElem +
                      lVar18 * 8 +
                      local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_fd8) *
                     local_ee0.fElem[uVar21] +
                     local_ac0.fElem[lVar19 + 10] *
                     *(double *)
                      ((long)local_f70.fElem +
                      lVar18 * 8 +
                      local_f70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar16);
                lVar18 = lVar18 + 1;
              } while (lVar18 != 3);
              local_1020 = local_1020 + 1;
              uVar21 = uVar21 + 1;
              lVar16 = lVar16 + 8;
              lVar17 = lVar17 + 8;
            } while (uVar21 != uVar24);
          }
          TPZManVector<long,_10>::~TPZManVector(&local_e48);
          TPZFMatrix<double>::~TPZFMatrix(&local_f70);
          TPZFMatrix<double>::~TPZFMatrix(&local_ee0);
        }
        if (local_fa8.fStore == local_f88) {
          local_fa8.fStore = (double *)0x0;
        }
        local_fa8.fNAlloc = 0;
        local_fa8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
        if (local_fa8.fStore != (double *)0x0) {
          operator_delete__(local_fa8.fStore);
        }
      }
      lVar19 = lVar19 + 1;
      paiVar20 = paiVar20 + 1;
      local_fd8 = local_fd8 + 8;
    } while (lVar19 != 4);
    uVar15 = order->fStore[10];
    if (3 < (int)uVar15) {
      uVar14 = uVar15 & 0x7ffffffc;
      uVar15 = uVar15 - 4;
      uVar22 = 0;
      uVar25 = 1;
      uVar26 = 2;
      uVar11 = 3;
      uVar28 = 0;
      uVar31 = 0;
      uVar33 = 0;
      uVar35 = 0;
      do {
        uVar34 = uVar35;
        uVar32 = uVar33;
        uVar30 = uVar31;
        uVar27 = uVar28;
        uVar39 = uVar11;
        uVar38 = uVar26;
        uVar37 = uVar25;
        uVar36 = uVar22;
        auVar29._0_4_ = uVar36 + 1;
        auVar29._4_4_ = uVar37 + 1;
        auVar29._8_4_ = uVar38 + 1;
        auVar29._12_4_ = uVar39 + 1;
        auVar40._4_4_ = uVar37 + 2;
        auVar40._12_4_ = uVar39 + 2;
        auVar40._0_4_ = auVar40._4_4_;
        auVar40._8_4_ = auVar40._12_4_;
        uVar28 = (auVar29._0_4_ * (uVar36 + 2) >> 1) + uVar27;
        uVar31 = ((uint)(auVar40._4_4_ * auVar29._4_4_) >> 1) + uVar30;
        uVar33 = ((uint)((auVar29._8_8_ & 0xffffffff) * (ulong)(uVar38 + 2)) >> 1) + uVar32;
        uVar35 = ((uint)((auVar40._8_8_ & 0xffffffff) * (ulong)auVar29._12_4_) >> 1) + uVar34;
        uVar14 = uVar14 - 4;
        uVar22 = uVar36 + 4;
        uVar25 = uVar37 + 4;
        uVar26 = uVar38 + 4;
        uVar11 = uVar39 + 4;
      } while (uVar14 != 0);
      uVar22 = -(uint)((int)(uVar15 ^ 0x80000000) < (int)(uVar36 ^ 0x80000000));
      uVar25 = -(uint)((int)(uVar15 ^ 0x80000000) < (int)(uVar37 ^ 0x80000000));
      uVar26 = -(uint)((int)(uVar15 ^ 0x80000000) < (int)(uVar38 ^ 0x80000000));
      uVar15 = -(uint)((int)(uVar15 ^ 0x80000000) < (int)(uVar39 ^ 0x80000000));
      uVar15 = (~uVar15 & uVar35 | uVar34 & uVar15) + (~uVar25 & uVar31 | uVar30 & uVar25) +
               (~uVar26 & uVar33 | uVar32 & uVar26) + (~uVar22 & uVar28 | uVar27 & uVar22);
      uVar24 = CONCAT44(0,uVar15);
      local_dd8._32_8_ = local_d48;
      local_dd8._16_8_ = 1;
      local_dd8._8_8_ = uVar24;
      local_dd8._24_2_ = 0;
      local_dd8._0_8_ = &PTR__TPZFMatrix_018e04a8;
      local_dd8._48_8_ = 0x50;
      local_dd8._40_8_ = local_dd8._32_8_;
      TPZVec<int>::TPZVec((TPZVec<int> *)(local_dd8 + 0x38),0);
      local_dd8._64_8_ = local_d80;
      local_dd8._56_8_ = &PTR__TPZManVector_0183cde8;
      local_dd8._72_16_ = (undefined1  [16])0x0;
      local_d68 = &PTR__TPZVec_0183b4b0;
      local_d60 = (undefined1  [16])0x0;
      local_d50 = 0;
      if (uVar15 == 0) {
        local_dd8._32_8_ = (double *)0x0;
      }
      else if (0x50 < uVar15) {
        local_dd8._32_8_ = operator_new__(uVar24 * 8);
      }
      local_dd8._0_8_ = &PTR__TPZFNMatrix_018e01b8;
      local_6e8 = local_678;
      lStack_6f8._0_4_ = uVar15;
      local_708._8_8_ = 3;
      lStack_6f8._4_4_ = 0;
      local_6f0 = 0;
      local_708._0_8_ = &PTR__TPZFMatrix_018e04a8;
      local_6d8 = 0x50;
      local_6e0 = local_6e8;
      TPZVec<int>::TPZVec((TPZVec<int> *)local_6d0,0);
      local_6d0._8_8_ = local_6b0;
      local_6d0._0_8_ = &PTR__TPZManVector_0183cde8;
      local_6d0._16_16_ = (undefined1  [16])0x0;
      local_698 = &PTR__TPZVec_0183b4b0;
      local_690 = (undefined1  [16])0x0;
      local_680 = 0;
      if (uVar15 == 0) {
        local_6e8 = (double *)0x0;
      }
      else if (0x1a < uVar15) {
        local_6e8 = (double *)operator_new__(uVar24 * 0x18);
      }
      local_708._0_8_ = &PTR__TPZFNMatrix_018e01b8;
      memset((void *)local_dd8._32_8_,0,local_dd8._8_8_ * local_dd8._16_8_ * 8);
      local_dd8._24_2_ = local_dd8._24_2_ & 0xff00;
      memset(local_6e8,0,local_708._8_8_ * lStack_6f8 * 8);
      local_6f0 = local_6f0 & 0xff00;
      ShapeInternal(pt,order->fStore[10],(TPZFMatrix<double> *)local_dd8,
                    (TPZFMatrix<double> *)local_708);
      if (uVar15 != 0) {
        local_1018 = (long)(int)local_1020;
        local_1020 = local_1018 * 8;
        lVar19 = 0;
        uVar21 = 0;
        do {
          if ((local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0xf) ||
             (local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((long)local_dd8._8_8_ <= (long)uVar21) || ((long)local_dd8._16_8_ < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_1018 < 0) ||
              ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_1018)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[local_1018] = local_ac0.fElem[0xe] * *(double *)(local_dd8._32_8_ + uVar21 * 8)
          ;
          lVar23 = 0;
          do {
            if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
               (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 0xf)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((long)local_dd8._8_8_ <= (long)uVar21) || ((long)local_dd8._16_8_ < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0xf) ||
               (local_ac0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((long)local_708._8_8_ <= lVar23) || (lStack_6f8 <= (long)uVar21)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar23) ||
                (local_1018 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_1018)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)
             ((long)dphi->fElem +
             lVar23 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_1020) =
                 local_3e8.fElem
                 [local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 0xe + lVar23] *
                 *(double *)(local_dd8._32_8_ + uVar21 * 8) +
                 local_ac0.fElem[0xe] *
                 *(double *)((long)local_6e8 + lVar23 * 8 + local_708._8_8_ * lVar19);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 3);
          local_1018 = local_1018 + 1;
          uVar21 = uVar21 + 1;
          lVar19 = lVar19 + 8;
          local_1020 = local_1020 + 8;
        } while (uVar21 != uVar24);
      }
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_708,&PTR_PTR_018e0470);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_dd8,&PTR_PTR_018e0470);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_0185f328);
    TPZFMatrix<double>::~TPZFMatrix(&local_ac0,&PTR_PTR_0185f328);
  }
  return;
}

Assistant:

void TPZShapeTetra::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
		for(is=NCornerNodes; is<NSides; is++) if(order[is-NCornerNodes] > 1) linear = false;
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		
		//  if(order[9]<2) return;
		int shape = 4;
		//rib shapes
		for (int rib = 0; rib < 6; rib++) {
			REAL outval;
			ProjectPoint3dTetraToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int ordin = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToTetra(rib,ordin,dphin);
			for (int i = 0; i < ordin; i++) {
				phi(shape,0) = phiblend(rib+4,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+4) * phin( i, 0) +
					phiblend(rib+4, 0 )  * dphin(xj,i);
				}
				shape++;
			}
		}
		//  if(order[10]<3) return;
		//face shapes
		for (int face = 0; face < 4; face++) {
			if (order[6+face] < 3) continue;
			TPZManVector<REAL,2> outval(2);
			ProjectPoint3dTetraToFace(face,pt,outval);
			REAL store1[20],store2[60];
			int ord1;//,ord2;
			//elt->FaceOrder(face,ord1,ord2);
			ord1 = order[6+face];
			//ord2 = ord1;
			if(ord1<3) continue;
			int ordin =  (ord1-2)*(ord1-1)/2;
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(3);
			//	int id0,id1,id2;
			int i;
			for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			//    id0 = ShapeFaceId[face][0];//indice das shapes da face que compoem a shape atual
			//    id1 = ShapeFaceId[face][1];//equivale a FaceIdsCube(face,ids,id,id0,id1);
			//    id2 = ShapeFaceId[face][2];
			int transid = TPZShapeTriang::GetTransformId2dT(ids);
			outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
			outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..)
			TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			int c = dphin.Cols();
			for(i=0;i<c;i++) {
				dphin(0,i) /= 2.;
				dphin(1,i) /= 2.;
				dphin(2,i) /= 2.;
			}
			TransformDerivativeFromFaceToTetra(face,ordin,dphin);//ord = numero de shapes
			for(i=0;i<ordin;i++)	{
				phi(shape,0) = phiblend(face+10,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+10) * phin(i ,0) +
					phiblend(face+10, 0) * dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[10]<4) return;
		//volume shapes
		int totsum = 0,sum;
		int i;
		for(i=0;i<order[10]-3;i++) {
			sum = (i+1)*(i+2) / 2;
			totsum += sum;
		}
		int ord = totsum;
		TPZFNMatrix<80> phin(ord,1),dphin(3,ord);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[10],phin,dphin);
		for(i=0;i<ord;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1) * phin(i ,0) +
				phiblend(NSides-1, 0) * dphin(xj,i);
			}
			shape++;
		}
	}